

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty.c++
# Opt level: O2

void __thiscall
capnp::TwoPartyVatNetwork::OutgoingMessageImpl::~OutgoingMessageImpl(OutgoingMessageImpl *this)

{
  kj::Array<int>::~Array(&this->fds);
  MallocMessageBuilder::~MallocMessageBuilder(&this->message);
  kj::Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

OutgoingMessageImpl(TwoPartyVatNetwork& network, uint firstSegmentWordSize)
      : network(network),
        message(firstSegmentWordSize == 0 ? SUGGESTED_FIRST_SEGMENT_WORDS : firstSegmentWordSize) {}